

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.cc
# Opt level: O1

pair<const_char_*,_bool> __thiscall
google::protobuf::internal::EpsCopyInputStream::DoneFallback<false>
          (EpsCopyInputStream *this,int overrun,int depth)

{
  char *pcVar1;
  Nonnull<const_char_*> pcVar2;
  int iVar3;
  undefined8 unaff_RBX;
  ulong uVar4;
  int unaff_EBP;
  uint uVar5;
  undefined1 *v1;
  undefined1 *v1_00;
  pair<const_char_*,_bool> pVar6;
  
  v1_00 = &stack0xffffffffffffffc8;
  v1 = &stack0xffffffffffffffc8;
  uVar5 = this->limit_;
  uVar4 = CONCAT71((int7)((ulong)unaff_RBX >> 8),1);
  if ((int)uVar5 < overrun) {
LAB_002fc7b7:
    pcVar1 = (char *)0x0;
    goto LAB_002fc7a8;
  }
  if (uVar5 == overrun) {
    DoneFallback<false>((EpsCopyInputStream *)&stack0xffffffffffffffc8);
LAB_002fc7c3:
    DoneFallback<false>((EpsCopyInputStream *)&stack0xffffffffffffffc8);
LAB_002fc7cb:
    DoneFallback<false>((EpsCopyInputStream *)&stack0xffffffffffffffc8);
    depth = unaff_EBP;
LAB_002fc7d3:
    pcVar2 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                       ((long)v1_00,0,"limit_ > 0");
  }
  else {
    if ((int)uVar5 <= overrun) goto LAB_002fc7c3;
    if (this->limit_end_ != this->buffer_end_ + (int)((int)uVar5 >> 0x1f & uVar5))
    goto LAB_002fc7cb;
    v1_00 = (undefined1 *)(long)(int)uVar5;
    if ((int)uVar5 < 1) goto LAB_002fc7d3;
    pcVar2 = (Nonnull<const_char_*>)0x0;
  }
  if (pcVar2 != (Nonnull<const_char_*>)0x0) {
LAB_002fc80c:
    DoneFallback<false>();
LAB_002fc817:
    DoneFallback<false>();
  }
  if (this->limit_end_ == this->buffer_end_) {
    do {
      if (overrun < 0) {
        pcVar2 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                           ((long)overrun,0,"overrun >= 0");
      }
      else {
        pcVar2 = (Nonnull<const_char_*>)0x0;
      }
      if (pcVar2 != (Nonnull<const_char_*>)0x0) {
        DoneFallback<false>();
        goto LAB_002fc80c;
      }
      pcVar1 = NextBuffer<false>(this,overrun,depth);
      if (pcVar1 == (char *)0x0) {
        if (overrun != 0) goto LAB_002fc7b7;
        v1 = (undefined1 *)(long)this->limit_;
        if ((long)v1 < 1) goto LAB_002fc7ee;
        pcVar2 = (Nonnull<const_char_*>)0x0;
        goto LAB_002fc77c;
      }
      iVar3 = (int)this->buffer_end_;
      uVar5 = ((int)pcVar1 - iVar3) + this->limit_;
      this->limit_ = uVar5;
      pcVar1 = pcVar1 + overrun;
      overrun = (int)pcVar1 - iVar3;
    } while (-1 < overrun);
    this->limit_end_ = this->buffer_end_ + (int)((int)uVar5 >> 0x1f & uVar5);
    uVar4 = 0;
  }
  else {
    DoneFallback<false>((EpsCopyInputStream *)&stack0xffffffffffffffc8);
LAB_002fc7ee:
    pcVar2 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>((long)v1,0,"limit_ > 0")
    ;
LAB_002fc77c:
    if (pcVar2 != (Nonnull<const_char_*>)0x0) goto LAB_002fc817;
    pcVar1 = this->buffer_end_;
    this->limit_end_ = pcVar1;
    this->last_tag_minus_1_ = 1;
  }
LAB_002fc7a8:
  pVar6._8_8_ = uVar4 & 0xffffffff;
  pVar6.first = pcVar1;
  return pVar6;
}

Assistant:

std::pair<const char*, bool> EpsCopyInputStream::DoneFallback(int overrun,
                                                              int depth) {
  // Did we exceeded the limit (parse error).
  if (ABSL_PREDICT_FALSE(overrun > limit_)) return {nullptr, true};
  ABSL_DCHECK(overrun != limit_);  // Guaranteed by caller.
  ABSL_DCHECK(overrun < limit_);   // Follows from above
  // TODO Instead of this dcheck we could just assign, and remove
  // updating the limit_end from PopLimit, ie.
  // limit_end_ = buffer_end_ + (std::min)(0, limit_);
  // if (ptr < limit_end_) return {ptr, false};
  ABSL_DCHECK(limit_end_ == buffer_end_ + (std::min)(0, limit_));
  // At this point we know the following assertion holds.
  ABSL_DCHECK_GT(limit_, 0);
  ABSL_DCHECK(limit_end_ == buffer_end_);  // because limit_ > 0
  const char* p;
  do {
    // We are past the end of buffer_end_, in the slop region.
    ABSL_DCHECK_GE(overrun, 0);
    p = NextBuffer<kExperimentalV2>(overrun, depth);
    if (p == nullptr) {
      // We are at the end of the stream
      if (ABSL_PREDICT_FALSE(overrun != 0)) return {nullptr, true};
      ABSL_DCHECK_GT(limit_, 0);
      limit_end_ = buffer_end_;
      // Distinguish ending on a pushed limit or ending on end-of-stream.
      SetEndOfStream();
      return {buffer_end_, true};
    }
    limit_ -= buffer_end_ - p;  // Adjust limit_ relative to new anchor
    p += overrun;
    overrun = p - buffer_end_;
  } while (overrun >= 0);
  limit_end_ = buffer_end_ + std::min(0, limit_);
  return {p, false};
}